

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FStateLabel * __thiscall FStateLabels::FindLabel(FStateLabels *this,FName *label)

{
  FStateLabel *pFVar1;
  FName local_4;
  
  pFVar1 = BinarySearch<FStateLabel,FName>(this->Labels,this->NumLabels,0,&local_4);
  return pFVar1;
}

Assistant:

FStateLabel *FStateLabels::FindLabel (FName label)
{
	return const_cast<FStateLabel *>(BinarySearch<FStateLabel, FName>(Labels, NumLabels, &FStateLabel::Label, label));
}